

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

M44f * anon_unknown.dwarf_6334f::createRandomMat(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float *pfVar1;
  Vec3<float> *in_RDI;
  float a;
  float b;
  double dVar2;
  V3f sh;
  int k;
  int j_1;
  int j;
  V3f h;
  V3f s;
  V3f r;
  V3f t;
  M44f *M;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Vec3<float> *in_stack_ffffffffffffff70;
  Vec3<float> *h_00;
  Matrix44<float> *in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar4;
  V3f *in_stack_ffffffffffffffa8;
  V3f *in_stack_ffffffffffffffb0;
  V3f *in_stack_ffffffffffffffb8;
  Rand48 *in_stack_ffffffffffffffc0;
  Vec3<float> local_34 [4];
  
  h_00 = in_RDI;
  Imath_2_5::Matrix44<float>::Matrix44((Matrix44<float> *)in_stack_ffffffffffffff70);
  Imath_2_5::Vec3<float>::Vec3(local_34);
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffc0);
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffb4);
  getRandTRS(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  Imath_2_5::Matrix44<float>::translate<float>
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  Imath_2_5::Matrix44<float>::rotate<float>((Matrix44<float> *)trans,rot);
  dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)h_00,(double)in_RDI,(double)in_stack_ffffffffffffff70);
  a = (float)dVar2;
  dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)h_00,(double)in_RDI,(double)in_stack_ffffffffffffff70);
  b = (float)dVar2;
  dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)h_00,(double)in_RDI,(double)in_stack_ffffffffffffff70);
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffa8,a,b,(float)dVar2);
  for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
    dVar2 = Imath_2_5::Rand48::nextf
                      ((Rand48 *)h_00,(double)in_RDI,(double)in_stack_ffffffffffffff70);
    if (0.5 <= dVar2) {
      pfVar1 = Imath_2_5::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffa8,iVar4);
      *pfVar1 = *pfVar1 * -1.0;
    }
  }
  Imath_2_5::Matrix44<float>::shear<float>((Matrix44<float> *)h_00,in_RDI);
  Imath_2_5::Matrix44<float>::scale<float>
            ((Matrix44<float> *)in_stack_ffffffffffffff70,
             (Vec3<float> *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      in_stack_ffffffffffffff70 =
           (Vec3<float> *)
           Imath_2_5::Rand48::nextf((Rand48 *)h_00,(double)in_RDI,(double)in_stack_ffffffffffffff70)
      ;
      pfVar1 = Imath_2_5::Matrix44<float>::operator[]((Matrix44<float> *)h_00,iVar4);
      pfVar1[iVar3] = (float)((double)pfVar1[iVar3] + (double)in_stack_ffffffffffffff70);
    }
  }
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff90);
  Imath_2_5::extractSHRT<float>
            (in_stack_ffffffffffffff90,(Vec3<float> *)CONCAT44(a,b),h_00,in_RDI,
             in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  return (M44f *)in_RDI;
}

Assistant:

M44f
createRandomMat(Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    
    M44f M;
    V3f t, r, s;
    getRandTRS(random, t, r, s);
    
    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0));

    for (int j=0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5)
            h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += random.nextf (-1e-7, 1e-7);

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));
    
    return M;
}